

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::terminate(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  uint uVar1;
  uint uVar2;
  SPxSense SVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  SPxOut *pSVar7;
  double *pdVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  long lVar13;
  byte bVar14;
  long local_4c8;
  Real local_4c0;
  Verbosity old_verbosity;
  uint uStack_4b4;
  uint auStack_4b0 [25];
  undefined3 uStack_44b;
  undefined5 uStack_448;
  undefined8 local_440;
  cpp_dec_float<200U,_int,_void> local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar14 = 0;
  uVar1 = (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).iterCount;
  if (10 < (int)uVar1) {
    uVar2 = (this->thecovectors->set).thenum;
    uVar11 = 1000;
    if (1000 < (int)uVar2) {
      uVar11 = (ulong)uVar2;
    }
    if ((int)((ulong)uVar1 % uVar11) == 0) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[(ulong)(this->theType != ENTER) + 0x7c])(this);
      computeFrhs(this);
      if (1 < (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar7 = this->spxout;
        if ((pSVar7 != (SPxOut *)0x0) && (4 < (int)pSVar7->m_verbosity)) {
          old_verbosity = pSVar7->m_verbosity;
          local_438.data._M_elems[0] = 5;
          (*pSVar7->_vptr_SPxOut[2])();
          pSVar7 = soplex::operator<<(this->spxout," --- terminate triggers refactorization");
          std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
        }
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this);
      }
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theCoPvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theCoPrhs);
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve(&this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,this->theFrhs);
      if (this->thePricing == FULL) {
        computePvec(this);
        if (this->theType == ENTER) {
          computeCoTest(this);
          computeTest(this);
        }
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6d])
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&old_verbosity,this);
      local_438.data._M_elems[0] = 0;
      local_438.data._M_elems[1] = 0;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity,(double *)&local_438);
      if (tVar4) {
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x6e])(this);
      }
    }
  }
  bVar10 = true;
  iVar6 = 0;
  lVar13 = 0x674;
  if ((uint)(this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus < 3) {
    bVar5 = isTimeLimitReached(this,false);
    if (bVar5) {
      pSVar7 = this->spxout;
      iVar6 = -7;
      if ((pSVar7 != (SPxOut *)0x0) && (3 < (int)pSVar7->m_verbosity)) {
        old_verbosity = pSVar7->m_verbosity;
        local_438.data._M_elems[0] = 4;
        (*pSVar7->_vptr_SPxOut[2])();
        pSVar7 = soplex::operator<<(this->spxout," --- timelimit (");
        pSVar7 = soplex::operator<<(pSVar7,this->maxTime);
        pSVar7 = soplex::operator<<(pSVar7,") reached");
        std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
      }
    }
    else {
      u = &this->objLimit;
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,*pdVar8,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        (u,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity);
      if ((tVar4) && (0 < this->theRep * this->theType)) {
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x6d])
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&old_verbosity,this);
        epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_438,this);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_438);
        if (tVar4) {
          result_2.m_backend.data._M_elems._0_8_ =
               Tolerances::floatingPointOpttol
                         ((this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          )._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x6d])(&local_3b8,this);
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                    (&result.m_backend,(double *)&result_2,&local_3b8);
          iVar6 = (*(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x74])(this,&result.m_backend);
          if ((char)iVar6 != '\0') {
            SVar3 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesense;
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x5e])(&local_438,this);
            local_440._0_4_ = cpp_dec_float_finite;
            local_440._4_4_ = 0x1c;
            old_verbosity = 0;
            uStack_4b4 = 0;
            auStack_4b0[0] = 0;
            auStack_4b0[1] = 0;
            auStack_4b0[2] = 0;
            auStack_4b0[3] = 0;
            auStack_4b0[4] = 0;
            auStack_4b0[5] = 0;
            auStack_4b0[6] = 0;
            auStack_4b0[7] = 0;
            auStack_4b0[8] = 0;
            auStack_4b0[9] = 0;
            auStack_4b0[10] = 0;
            auStack_4b0[0xb] = 0;
            auStack_4b0[0xc] = 0;
            auStack_4b0[0xd] = 0;
            auStack_4b0[0x16] = 0;
            auStack_4b0[0x17] = 0;
            stack0xfffffffffffffbb0 = 0;
            uStack_44b = 0;
            uStack_448._0_4_ = 0;
            uStack_448._4_1_ = false;
            auStack_4b0[0xe] = 0;
            auStack_4b0[0xf] = 0;
            auStack_4b0[0x10] = 0;
            auStack_4b0[0x11] = 0;
            auStack_4b0[0x12] = 0;
            auStack_4b0[0x13] = 0;
            auStack_4b0[0x14] = 0;
            auStack_4b0[0x15] = 0;
            local_3b8.data._M_elems._0_8_ = (long)SVar3;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                      ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_438,
                       (longlong *)&local_3b8);
            result_2.m_backend.data._M_elems._0_8_ =
                 SEXT48((this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesense);
            local_3b8.fpclass = cpp_dec_float_finite;
            local_3b8.prec_elem = 0x1c;
            local_3b8.data._M_elems[0] = 0;
            local_3b8.data._M_elems[1] = 0;
            local_3b8.data._M_elems[2] = 0;
            local_3b8.data._M_elems[3] = 0;
            local_3b8.data._M_elems[4] = 0;
            local_3b8.data._M_elems[5] = 0;
            local_3b8.data._M_elems[6] = 0;
            local_3b8.data._M_elems[7] = 0;
            local_3b8.data._M_elems[8] = 0;
            local_3b8.data._M_elems[9] = 0;
            local_3b8.data._M_elems[10] = 0;
            local_3b8.data._M_elems[0xb] = 0;
            local_3b8.data._M_elems[0xc] = 0;
            local_3b8.data._M_elems[0xd] = 0;
            local_3b8.data._M_elems[0xe] = 0;
            local_3b8.data._M_elems[0xf] = 0;
            local_3b8.data._M_elems[0x18] = 0;
            local_3b8.data._M_elems[0x19] = 0;
            local_3b8.data._M_elems._104_5_ = 0;
            local_3b8.data._M_elems[0x1b]._1_3_ = 0;
            local_3b8.exp = 0;
            local_3b8.neg = false;
            local_3b8.data._M_elems[0x10] = 0;
            local_3b8.data._M_elems[0x11] = 0;
            local_3b8.data._M_elems[0x12] = 0;
            local_3b8.data._M_elems[0x13] = 0;
            local_3b8.data._M_elems[0x14] = 0;
            local_3b8.data._M_elems[0x15] = 0;
            local_3b8.data._M_elems[0x16] = 0;
            local_3b8.data._M_elems[0x17] = 0;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                      (&local_3b8,&u->m_backend,(longlong *)&result_2);
            tVar4 = boost::multiprecision::operator<=
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_3b8);
            if (tVar4) {
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x5f])(this);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x6d])
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity,this);
              epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_438,this);
              tVar4 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&old_verbosity,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_438);
              if (tVar4) {
                local_4c0 = Tolerances::floatingPointOpttol
                                      ((this->
                                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       )._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
                (*(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x6d])(&local_3b8,this);
                local_1b8.fpclass = cpp_dec_float_finite;
                local_1b8.prec_elem = 0x1c;
                local_1b8.data._M_elems[0] = 0;
                local_1b8.data._M_elems[1] = 0;
                local_1b8.data._M_elems[2] = 0;
                local_1b8.data._M_elems[3] = 0;
                local_1b8.data._M_elems[4] = 0;
                local_1b8.data._M_elems[5] = 0;
                local_1b8.data._M_elems[6] = 0;
                local_1b8.data._M_elems[7] = 0;
                local_1b8.data._M_elems[8] = 0;
                local_1b8.data._M_elems[9] = 0;
                local_1b8.data._M_elems[10] = 0;
                local_1b8.data._M_elems[0xb] = 0;
                local_1b8.data._M_elems[0xc] = 0;
                local_1b8.data._M_elems[0xd] = 0;
                local_1b8.data._M_elems[0xe] = 0;
                local_1b8.data._M_elems[0xf] = 0;
                local_1b8.data._M_elems[0x10] = 0;
                local_1b8.data._M_elems[0x11] = 0;
                local_1b8.data._M_elems[0x12] = 0;
                local_1b8.data._M_elems[0x13] = 0;
                local_1b8.data._M_elems[0x14] = 0;
                local_1b8.data._M_elems[0x15] = 0;
                local_1b8.data._M_elems[0x16] = 0;
                local_1b8.data._M_elems[0x17] = 0;
                local_1b8.data._M_elems[0x18] = 0;
                local_1b8.data._M_elems[0x19] = 0;
                local_1b8.data._M_elems._104_5_ = 0;
                local_1b8.data._M_elems[0x1b]._1_3_ = 0;
                local_1b8.exp = 0;
                local_1b8.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                          (&local_1b8,&local_4c0,&local_3b8);
                iVar6 = (*(this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .
                          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._vptr_ClassArray[0x74])(this,&local_1b8);
                if ((char)iVar6 != '\0') {
                  SVar3 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesense;
                  (*(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x5e])(&local_2b8,this);
                  result_2.m_backend.fpclass = cpp_dec_float_finite;
                  result_2.m_backend.prec_elem = 0x1c;
                  result_2.m_backend.data._M_elems[0] = 0;
                  result_2.m_backend.data._M_elems[1] = 0;
                  result_2.m_backend.data._M_elems[2] = 0;
                  result_2.m_backend.data._M_elems[3] = 0;
                  result_2.m_backend.data._M_elems[4] = 0;
                  result_2.m_backend.data._M_elems[5] = 0;
                  result_2.m_backend.data._M_elems[6] = 0;
                  result_2.m_backend.data._M_elems[7] = 0;
                  result_2.m_backend.data._M_elems[8] = 0;
                  result_2.m_backend.data._M_elems[9] = 0;
                  result_2.m_backend.data._M_elems[10] = 0;
                  result_2.m_backend.data._M_elems[0xb] = 0;
                  result_2.m_backend.data._M_elems[0xc] = 0;
                  result_2.m_backend.data._M_elems[0xd] = 0;
                  result_2.m_backend.data._M_elems[0xe] = 0;
                  result_2.m_backend.data._M_elems[0xf] = 0;
                  result_2.m_backend.data._M_elems[0x18] = 0;
                  result_2.m_backend.data._M_elems[0x19] = 0;
                  result_2.m_backend.data._M_elems._104_5_ = 0;
                  result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_2.m_backend.exp = 0;
                  result_2.m_backend.neg = false;
                  result_2.m_backend.data._M_elems[0x10] = 0;
                  result_2.m_backend.data._M_elems[0x11] = 0;
                  result_2.m_backend.data._M_elems[0x12] = 0;
                  result_2.m_backend.data._M_elems[0x13] = 0;
                  result_2.m_backend.data._M_elems[0x14] = 0;
                  result_2.m_backend.data._M_elems[0x15] = 0;
                  result_2.m_backend.data._M_elems[0x16] = 0;
                  result_2.m_backend.data._M_elems[0x17] = 0;
                  local_4c8 = (long)SVar3;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                            (&result_2.m_backend,&local_2b8,&local_4c8);
                  local_4c8 = (long)(this->
                                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).thesense;
                  local_238.fpclass = cpp_dec_float_finite;
                  local_238.prec_elem = 0x1c;
                  local_238.data._M_elems[0] = 0;
                  local_238.data._M_elems[1] = 0;
                  local_238.data._M_elems[2] = 0;
                  local_238.data._M_elems[3] = 0;
                  local_238.data._M_elems[4] = 0;
                  local_238.data._M_elems[5] = 0;
                  local_238.data._M_elems[6] = 0;
                  local_238.data._M_elems[7] = 0;
                  local_238.data._M_elems[8] = 0;
                  local_238.data._M_elems[9] = 0;
                  local_238.data._M_elems[10] = 0;
                  local_238.data._M_elems[0xb] = 0;
                  local_238.data._M_elems[0xc] = 0;
                  local_238.data._M_elems[0xd] = 0;
                  local_238.data._M_elems[0xe] = 0;
                  local_238.data._M_elems[0xf] = 0;
                  local_238.data._M_elems[0x10] = 0;
                  local_238.data._M_elems[0x11] = 0;
                  local_238.data._M_elems[0x12] = 0;
                  local_238.data._M_elems[0x13] = 0;
                  local_238.data._M_elems[0x14] = 0;
                  local_238.data._M_elems[0x15] = 0;
                  local_238.data._M_elems[0x16] = 0;
                  local_238.data._M_elems[0x17] = 0;
                  local_238.data._M_elems[0x18] = 0;
                  local_238.data._M_elems[0x19] = 0;
                  local_238.data._M_elems._104_5_ = 0;
                  local_238.data._M_elems[0x1b]._1_3_ = 0;
                  local_238.exp = 0;
                  local_238.neg = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                            (&local_238,&u->m_backend,&local_4c8);
                  tVar4 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_2.m_backend,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_238);
                  if (tVar4) {
                    pSVar7 = this->spxout;
                    if ((pSVar7 != (SPxOut *)0x0) && (3 < (int)pSVar7->m_verbosity)) {
                      old_verbosity = pSVar7->m_verbosity;
                      local_438.data._M_elems[0] = 4;
                      (*pSVar7->_vptr_SPxOut[2])();
                      pSVar7 = soplex::operator<<(this->spxout," --- objective value limit (");
                      pnVar12 = &local_b0;
                      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                        (pnVar12->m_backend).data._M_elems[0] = (u->m_backend).data._M_elems[0];
                        u = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)u + (ulong)bVar14 * -8 + 4);
                        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
                      }
                      local_b0.m_backend.exp = (this->objLimit).m_backend.exp;
                      local_b0.m_backend.neg = (this->objLimit).m_backend.neg;
                      local_b0.m_backend.fpclass = (this->objLimit).m_backend.fpclass;
                      local_b0.m_backend.prec_elem = (this->objLimit).m_backend.prec_elem;
                      pSVar7 = soplex::operator<<(pSVar7,&local_b0);
                      pSVar7 = soplex::operator<<(pSVar7,") reached");
                      std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity])
                      ;
                      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
                    }
                    (*(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x5e])(&old_verbosity,this);
                    iVar6 = -5;
                    goto LAB_003ba7ac;
                  }
                }
              }
            }
          }
        }
      }
      iVar6 = (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).iterCount;
      lVar13 = 0x414;
      bVar10 = false;
    }
  }
LAB_003ba7ac:
  *(int *)((long)&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray + lVar13) = iVar6;
  return bVar10;
}

Assistant:

bool SPxSolverBase<R>::terminate()
{
#ifdef ENABLE_ADDITIONAL_CHECKS

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::SINGULAR)
      testVecs();

#endif

   int redo = dim();

   if(redo < 1000)
      redo = 1000;

   if(this->iteration() > 10 && this->iteration() % redo == 0)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      VectorBase<R> cr(*theCoPrhs);
      VectorBase<R> fr(*theFrhs);
#endif

      if(type() == ENTER)
         computeEnterCoPrhs();
      else
         computeLeaveCoPrhs();

      computeFrhs();

#ifdef ENABLE_ADDITIONAL_CHECKS
      cr -= *theCoPrhs;
      fr -= *theFrhs;

      if(cr.length() > leavetol())
         SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE50 unexpected change of coPrhs "
                         << cr.length() << std::endl;)
         if(fr.length() > entertol())
            SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE51 unexpected change of   Frhs "
                            << fr.length() << std::endl;)
#endif

            if(this->updateCount > 1)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << " --- terminate triggers refactorization"
                             << std::endl;)
               factorize();
            }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      if(pricing() == FULL)
      {
         computePvec();

         if(type() == ENTER)
         {
            computeCoTest();
            computeTest();
         }
      }

      if(shift() > 0.0)
         unShift();
   }

   // check time limit and objective limit only for non-terminal bases
   if(SPxBasisBase<R>::status() >= SPxBasisBase<R>::OPTIMAL  ||
         SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR)
   {
      m_status = UNKNOWN;
      return true;
   }

   if(isTimeLimitReached())
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- timelimit (" << maxTime
                    << ") reached" << std::endl;)
      m_status = ABORT_TIME;
      return true;
   }

   // objLimit is set and we are running DUAL:
   // - objLimit is set if objLimit < R(infinity)
   // - DUAL is running if rep() * type() > 0 == DUAL (-1 == PRIMAL)
   //
   // In this case we have given a objective value limit, e.g, through a
   // MIP solver, and we want stop solving the LP if we figure out that the
   // optimal value of the current LP can not be better then this objective
   // limit. More precisely:
   // - MINIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit <= current objective value of the DUAL LP
   // - MAXIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit >= current objective value of the DUAL LP
   if(objLimit < R(infinity) && type() * rep() > 0)
   {
      // We have no bound shifts; therefore, we can trust the current
      // objective value.
      // It might be even possible to use this termination value in case of
      // bound violations (shifting) but in this case it is quite difficult
      // to determine if we already reached the limit.
      if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift()))
      {
         // SPxSense::MINIMIZE == -1, so we have sign = 1 on minimizing
         if(int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
         {
            // ensure that solution is accurate
            factorizeAndRecompute();

            // check no violations and objective limit again
            if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift())
                  && int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- objective value limit (" << objLimit
                             << ") reached" << std::endl;)
               SPxOut::debug(this, " --- objective value limit reached\n (value:{} limit:{})\n", value(),
                             objLimit);
               SPxOut::debug(this, " (spxSense:{} rep:{} type:{})\n", int(this->spxSense()), int(rep()),
                             int(type()));

               m_status = ABORT_VALUE;
               return true;
            }
         }
      }
   }

   this->lastIterCount = this->iterCount;

   return false;
}